

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Snapshot * __thiscall leveldb::DBImpl::GetSnapshot(DBImpl *this)

{
  uint64_t sequence_number;
  SnapshotImpl *pSVar1;
  MutexLock local_18;
  MutexLock l;
  DBImpl *this_local;
  
  l.mu_ = (Mutex *)this;
  MutexLock::MutexLock(&local_18,&this->mutex_);
  sequence_number = VersionSet::LastSequence(this->versions_);
  pSVar1 = SnapshotList::New(&this->snapshots_,sequence_number);
  MutexLock::~MutexLock(&local_18);
  return &pSVar1->super_Snapshot;
}

Assistant:

const Snapshot* DBImpl::GetSnapshot() {
  MutexLock l(&mutex_);
  return snapshots_.New(versions_->LastSequence());
}